

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

int __thiscall
Json::ValueIteratorBase::copy(ValueIteratorBase *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX EVar1;
  _Base_ptr p_Var2;
  
  p_Var2 = *(_Base_ptr *)dst;
  (this->current_)._M_node = p_Var2;
  EVar1 = dst[8];
  this->isNull_ = (bool)EVar1;
  return (int)CONCAT71((int7)((ulong)p_Var2 >> 8),EVar1);
}

Assistant:

void ValueIteratorBase::copy(const SelfType& other) {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  current_ = other.current_;
  isNull_ = other.isNull_;
#else
  if (isArray_)
    iterator_.array_ = other.iterator_.array_;
  iterator_.map_ = other.iterator_.map_;
#endif
}